

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O0

Variant * Jinx::Impl::IsEmpty(Variant *__return_storage_ptr__,ScriptPtr *param_1,Parameters *params)

{
  bool bVar1;
  ValueType VVar2;
  const_reference pvVar3;
  element_type *this;
  element_type *this_00;
  size_t sVar4;
  undefined1 local_70 [64];
  undefined1 local_30 [24];
  Parameters *params_local;
  ScriptPtr *param_0_local;
  
  local_30._16_8_ = params;
  params_local = (Parameters *)param_1;
  param_0_local = (ScriptPtr *)__return_storage_ptr__;
  pvVar3 = std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[](params,0);
  VVar2 = Jinx::Variant::GetType(pvVar3);
  if (VVar2 == String) {
    pvVar3 = std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[]
                       ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)local_30._16_8_,0)
    ;
    Jinx::Variant::GetString_abi_cxx11_((String *)(local_70 + 0x10),pvVar3);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::empty
                      ((String *)(local_70 + 0x10));
    Jinx::Variant::Variant(__return_storage_ptr__,bVar1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
               (local_70 + 0x10));
  }
  else if (VVar2 == Collection) {
    std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[]
              ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)local_30._16_8_,0);
    Jinx::Variant::GetCollection((Variant *)local_30);
    this = std::
           __shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    bVar1 = std::
            map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
            ::empty(this);
    Jinx::Variant::Variant(__return_storage_ptr__,bVar1);
    std::
    shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
    ::~shared_ptr((shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                   *)local_30);
  }
  else if (VVar2 == Buffer) {
    std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[]
              ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)local_30._16_8_,0);
    Jinx::Variant::GetBuffer((Variant *)local_70);
    this_00 = std::__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_70);
    sVar4 = Buffer::Size(this_00);
    Jinx::Variant::Variant(__return_storage_ptr__,sVar4 == 0);
    std::shared_ptr<Jinx::Buffer>::~shared_ptr((shared_ptr<Jinx::Buffer> *)local_70);
  }
  else {
    Jinx::Variant::Variant(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Variant IsEmpty(ScriptPtr, const Parameters & params)
	{
		switch (params[0].GetType())
		{
		case ValueType::Collection:
			return params[0].GetCollection()->empty();
		case ValueType::String:
			return params[0].GetString().empty();
		case ValueType::Buffer:
			return params[0].GetBuffer()->Size() == 0;
		default:
			break;
		}
		return nullptr;
	}